

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

Vec_Int_t * Ga2_ManAbsTranslate(Ga2_Man_t *p)

{
  Gia_Man_t *p_00;
  int iVar1;
  Vec_Int_t *p_01;
  bool bVar2;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vGateClasses;
  Ga2_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p->pGia);
  p_01 = Vec_IntStart(iVar1);
  Vec_IntWriteEntry(p_01,0,1);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vAbs);
    bVar2 = false;
    if (local_24 < iVar1) {
      p_00 = p->pGia;
      iVar1 = Vec_IntEntry(p->vAbs,local_24);
      pGStack_20 = Gia_ManObj(p_00,iVar1);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsRo(p->pGia,pGStack_20);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsConst0(pGStack_20);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/abs/absGla.c"
                        ,0x443,"Vec_Int_t *Ga2_ManAbsTranslate(Ga2_Man_t *)");
        }
      }
      else {
        iVar1 = Gia_ObjId(p->pGia,pGStack_20);
        Vec_IntWriteEntry(p_01,iVar1,1);
      }
    }
    else {
      Ga2_ManAbsTranslate_rec(p->pGia,pGStack_20,p_01,1);
    }
    local_24 = local_24 + 1;
  }
  return p_01;
}

Assistant:

Vec_Int_t * Ga2_ManAbsTranslate( Ga2_Man_t * p )
{
    Vec_Int_t * vGateClasses;
    Gia_Obj_t * pObj;
    int i;
    vGateClasses = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    Vec_IntWriteEntry( vGateClasses, 0, 1 );
    Gia_ManForEachObjVec( p->vAbs, p->pGia, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Ga2_ManAbsTranslate_rec( p->pGia, pObj, vGateClasses, 1 );
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
            Vec_IntWriteEntry( vGateClasses, Gia_ObjId(p->pGia, pObj), 1 );
        else if ( !Gia_ObjIsConst0(pObj) )
            assert( 0 );
//        Gia_ObjPrint( p->pGia, pObj );
    }
    return vGateClasses;
}